

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiNoncentralAbsolutePoseSacProblem.hpp
# Opt level: O2

void __thiscall
opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem::
MultiNoncentralAbsolutePoseSacProblem
          (MultiNoncentralAbsolutePoseSacProblem *this,adapter_t *adapter,bool asCentral)

{
  int iVar1;
  undefined4 extraout_var;
  size_t i;
  ulong uVar2;
  int local_6c;
  vector<int,_std::allocator<int>_> numberCorrespondences;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  sac::MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::
  MultiSampleConsensusProblem
            (&this->super_MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,true);
  uVar2 = 0;
  (this->super_MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
  _vptr_MultiSampleConsensusProblem = (_func_int **)&PTR__MultiSampleConsensusProblem_002d6c70;
  this->_adapter = adapter;
  this->_asCentral = asCentral;
  numberCorrespondences.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  numberCorrespondences.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  numberCorrespondences.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    iVar1 = (*(adapter->super_AbsoluteAdapterBase)._vptr_AbsoluteAdapterBase[0xe])(adapter);
    if (CONCAT44(extraout_var,iVar1) <= uVar2) break;
    local_6c = (*(adapter->super_AbsoluteAdapterBase)._vptr_AbsoluteAdapterBase[0xd])(adapter,uVar2)
    ;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&numberCorrespondences,&local_6c);
    uVar2 = uVar2 + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,&numberCorrespondences);
  sac::MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::setUniformIndices
            (&this->super_MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,
             (vector<int,_std::allocator<int>_> *)&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&numberCorrespondences.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

MultiNoncentralAbsolutePoseSacProblem(adapter_t & adapter, bool asCentral = false) :
      sac::MultiSampleConsensusProblem<model_t> (),
      _adapter(adapter),
      _asCentral(asCentral)
  {
    std::vector<int> numberCorrespondences;
    for(size_t i = 0; i < adapter.getNumberFrames(); i++)
      numberCorrespondences.push_back(adapter.getNumberCorrespondences(i));
    setUniformIndices(numberCorrespondences);
  }